

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

void ncnn::embed_int8(Mat *bottom_blob,Mat *weight_data,float weight_data_int8_scale,Mat *bias_data,
                     Mat *top_blob,int input_dim,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  int local_98;
  int local_94;
  int local_84;
  int p_1;
  int p;
  char *em;
  float descale_em;
  int word_index;
  float *outptr;
  int q;
  float *bias_ptr;
  int words;
  int num_output;
  Option *opt_local;
  int input_dim_local;
  Mat *top_blob_local;
  Mat *bias_data_local;
  float weight_data_int8_scale_local;
  Mat *weight_data_local;
  Mat *bottom_blob_local;
  
  iVar1 = top_blob->w;
  iVar2 = top_blob->h;
  pvVar3 = bias_data->data;
  for (em._4_4_ = 0; em._4_4_ < iVar2; em._4_4_ = em._4_4_ + 1) {
    pvVar4 = top_blob->data;
    lVar6 = (long)top_blob->w * (long)em._4_4_ * top_blob->elemsize;
    local_84 = *(int *)((long)bottom_blob->data + (long)em._4_4_ * 4);
    if (local_84 < 0) {
      local_84 = 0;
    }
    if (input_dim <= local_84) {
      local_84 = input_dim + -1;
    }
    pvVar5 = weight_data->data;
    if (pvVar3 == (void *)0x0) {
      for (local_98 = 0; local_98 < iVar1; local_98 = local_98 + 1) {
        *(float *)((long)pvVar4 + (long)local_98 * 4 + lVar6) =
             (float)(int)*(char *)((long)pvVar5 + (long)local_98 + (long)(iVar1 * local_84)) *
             (1.0 / weight_data_int8_scale);
      }
    }
    else {
      for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
        *(float *)((long)pvVar4 + (long)local_94 * 4 + lVar6) =
             (float)(int)*(char *)((long)pvVar5 + (long)local_94 + (long)(iVar1 * local_84)) *
             (1.0 / weight_data_int8_scale) + *(float *)((long)pvVar3 + (long)local_94 * 4);
      }
    }
  }
  return;
}

Assistant:

static void embed_int8(const Mat& bottom_blob, const Mat& weight_data, float weight_data_int8_scale, const Mat& bias_data, Mat& top_blob, int input_dim, const Option& opt)
{
    const int num_output = top_blob.w;
    const int words = top_blob.h;

    const float* bias_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float descale_em = 1.f / weight_data_int8_scale;

        const signed char* em = (const signed char*)weight_data + num_output * word_index;

        if (bias_ptr)
        {
            for (int p = 0; p < num_output; p++)
            {
                outptr[p] = em[p] * descale_em + bias_ptr[p];
            }
        }
        else
        {
            for (int p = 0; p < num_output; p++)
            {
                outptr[p] = em[p] * descale_em;
            }
        }
    }
}